

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  RayK<8> *pRVar2;
  RayK<8> *pRVar3;
  RayK<8> *pRVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  BVH *bvh;
  NodeRef root;
  RayK<8> *pRVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  uint uVar13;
  size_t k;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [24];
  undefined1 auVar46 [24];
  undefined1 auVar47 [24];
  undefined1 auVar48 [24];
  undefined1 auVar49 [24];
  undefined1 auVar50 [24];
  undefined1 auVar51 [36];
  int iVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  size_t *psVar56;
  ulong uVar57;
  undefined1 (*pauVar58) [32];
  RayK<8> *pRVar59;
  long lVar60;
  ulong uVar61;
  undefined4 uVar62;
  RayK<8> *unaff_R15;
  bool bVar63;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  uint uVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined4 uVar88;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  uint uVar83;
  uint uVar84;
  uint uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined1 in_ZMM2 [64];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [36];
  undefined1 auVar121 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar123 [36];
  undefined1 auVar122 [64];
  undefined1 in_ZMM15 [64];
  Precalculations pre;
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d81;
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [32];
  RayK<8> *local_5d00;
  Intersectors *local_5cf8;
  RayK<8> *local_5cf0;
  RayQueryContext *local_5ce8;
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [8];
  float fStack_5cb8;
  float fStack_5cb4;
  float fStack_5cb0;
  float fStack_5cac;
  float fStack_5ca8;
  float fStack_5ca4;
  undefined1 local_5ca0 [8];
  float fStack_5c98;
  float fStack_5c94;
  float fStack_5c90;
  float fStack_5c8c;
  float fStack_5c88;
  float fStack_5c84;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined1 local_5c20 [32];
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined8 local_5ba0;
  undefined8 uStack_5b98;
  undefined8 uStack_5b90;
  undefined8 uStack_5b88;
  undefined8 local_5b80;
  undefined8 uStack_5b78;
  undefined8 uStack_5b70;
  undefined8 uStack_5b68;
  undefined8 local_5b60;
  undefined8 uStack_5b58;
  undefined8 uStack_5b50;
  undefined8 uStack_5b48;
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  float local_5ac0;
  float fStack_5abc;
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  float fStack_5aa4;
  float local_5aa0;
  float fStack_5a9c;
  float fStack_5a98;
  float fStack_5a94;
  float fStack_5a90;
  float fStack_5a8c;
  float fStack_5a88;
  float fStack_5a84;
  float local_5a80;
  float fStack_5a7c;
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  float fStack_5a64;
  float local_5a60;
  float fStack_5a5c;
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  float fStack_5a44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  undefined4 uStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar82 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar71 = ZEXT816(0) << 0x40;
      auVar70 = vpcmpeqd_avx2(auVar82,(undefined1  [32])valid_i->field_0);
      auVar82 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar71),5);
      auVar72 = auVar70 & auVar82;
      if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar72 >> 0x7f,0) != '\0') ||
            (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar72 >> 0xbf,0) != '\0') ||
          (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar72[0x1f] < '\0') {
        auVar82 = vandps_avx(auVar82,auVar70);
        local_5a40._0_4_ = *(undefined4 *)ray;
        local_5a40._4_4_ = *(undefined4 *)(ray + 4);
        local_5a40._8_4_ = *(undefined4 *)(ray + 8);
        local_5a40._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5a40._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5a40._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5a40._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5a40._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5a40._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5a40._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5a40._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5a40._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5a40._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5a40._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5a40._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5a40._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5a40._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5a40._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5a40._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        local_5c20._8_4_ = 0x7fffffff;
        local_5c20._0_8_ = 0x7fffffff7fffffff;
        local_5c20._12_4_ = 0x7fffffff;
        local_5c20._16_4_ = 0x7fffffff;
        local_5c20._20_4_ = 0x7fffffff;
        local_5c20._24_4_ = 0x7fffffff;
        local_5c20._28_4_ = 0x7fffffff;
        auVar116._8_4_ = 0x219392ef;
        auVar116._0_8_ = 0x219392ef219392ef;
        auVar116._12_4_ = 0x219392ef;
        auVar116._16_4_ = 0x219392ef;
        auVar116._20_4_ = 0x219392ef;
        auVar116._24_4_ = 0x219392ef;
        auVar116._28_4_ = 0x219392ef;
        auVar72 = vandps_avx(local_5c20,local_59e0);
        auVar72 = vcmpps_avx(auVar72,auVar116,1);
        auVar70 = vblendvps_avx(local_59e0,auVar116,auVar72);
        auVar72 = vandps_avx(local_5c20,local_59c0);
        auVar72 = vcmpps_avx(auVar72,auVar116,1);
        auVar91 = vblendvps_avx(local_59c0,auVar116,auVar72);
        auVar72 = vandps_avx(local_59a0,local_5c20);
        auVar72 = vcmpps_avx(auVar72,auVar116,1);
        auVar72 = vblendvps_avx(local_59a0,auVar116,auVar72);
        auVar9 = vpackssdw_avx(auVar82._0_16_,auVar82._16_16_);
        auVar82 = vrcpps_avx(auVar70);
        auVar113._8_4_ = 0x3f800000;
        auVar113._0_8_ = &DAT_3f8000003f800000;
        auVar113._12_4_ = 0x3f800000;
        auVar113._16_4_ = 0x3f800000;
        auVar113._20_4_ = 0x3f800000;
        auVar113._24_4_ = 0x3f800000;
        auVar113._28_4_ = 0x3f800000;
        auVar17 = vfnmadd213ps_fma(auVar70,auVar82,auVar113);
        auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar82,auVar82);
        auVar82 = vrcpps_avx(auVar91);
        auVar18 = vfnmadd213ps_fma(auVar91,auVar82,auVar113);
        auVar70 = vrcpps_avx(auVar72);
        auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar82,auVar82);
        auVar19 = vfnmadd213ps_fma(auVar72,auVar70,auVar113);
        auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar70,auVar70);
        local_5980 = ZEXT1632(auVar17);
        local_5960 = ZEXT1632(auVar18);
        local_5940 = ZEXT1632(auVar19);
        local_5920 = auVar17._0_4_ * (float)local_5a40._0_4_;
        fStack_591c = auVar17._4_4_ * (float)local_5a40._4_4_;
        fStack_5918 = auVar17._8_4_ * (float)local_5a40._8_4_;
        fStack_5914 = auVar17._12_4_ * (float)local_5a40._12_4_;
        fStack_5910 = (float)local_5a40._16_4_ * 0.0;
        fStack_590c = (float)local_5a40._20_4_ * 0.0;
        fStack_5908 = (float)local_5a40._24_4_ * 0.0;
        local_5900 = (float)local_5a40._32_4_ * auVar18._0_4_;
        fStack_58fc = (float)local_5a40._36_4_ * auVar18._4_4_;
        fStack_58f8 = (float)local_5a40._40_4_ * auVar18._8_4_;
        fStack_58f4 = (float)local_5a40._44_4_ * auVar18._12_4_;
        fStack_58f0 = (float)local_5a40._48_4_ * 0.0;
        fStack_58ec = (float)local_5a40._52_4_ * 0.0;
        fStack_58e8 = (float)local_5a40._56_4_ * 0.0;
        local_58e0 = (float)local_5a40._64_4_ * auVar19._0_4_;
        fStack_58dc = (float)local_5a40._68_4_ * auVar19._4_4_;
        fStack_58d8 = (float)local_5a40._72_4_ * auVar19._8_4_;
        fStack_58d4 = (float)local_5a40._76_4_ * auVar19._12_4_;
        fStack_58d0 = (float)local_5a40._80_4_ * 0.0;
        fStack_58cc = (float)local_5a40._84_4_ * 0.0;
        fStack_58c8 = (float)local_5a40._88_4_ * 0.0;
        auVar82 = vcmpps_avx(local_5980,ZEXT1632(auVar71),1);
        auVar91._8_4_ = 0x20;
        auVar91._0_8_ = 0x2000000020;
        auVar91._12_4_ = 0x20;
        auVar91._16_4_ = 0x20;
        auVar91._20_4_ = 0x20;
        auVar91._24_4_ = 0x20;
        auVar91._28_4_ = 0x20;
        local_58c0 = vandps_avx(auVar82,auVar91);
        auVar72 = ZEXT1632(auVar71);
        auVar82 = vcmpps_avx(ZEXT1632(auVar18),auVar72,5);
        auVar92._8_4_ = 0x40;
        auVar92._0_8_ = 0x4000000040;
        auVar92._12_4_ = 0x40;
        auVar92._16_4_ = 0x40;
        auVar92._20_4_ = 0x40;
        auVar92._24_4_ = 0x40;
        auVar92._28_4_ = 0x40;
        auVar97._8_4_ = 0x60;
        auVar97._0_8_ = 0x6000000060;
        auVar97._12_4_ = 0x60;
        auVar97._16_4_ = 0x60;
        auVar97._20_4_ = 0x60;
        auVar97._24_4_ = 0x60;
        auVar97._28_4_ = 0x60;
        local_58a0 = vblendvps_avx(auVar97,auVar92,auVar82);
        auVar82 = vcmpps_avx(ZEXT1632(auVar19),auVar72,5);
        auVar93._8_4_ = 0x80;
        auVar93._0_8_ = 0x8000000080;
        auVar93._12_4_ = 0x80;
        auVar93._16_4_ = 0x80;
        auVar93._20_4_ = 0x80;
        auVar93._24_4_ = 0x80;
        auVar93._28_4_ = 0x80;
        auVar98._8_4_ = 0xa0;
        auVar98._0_8_ = 0xa0000000a0;
        auVar98._12_4_ = 0xa0;
        auVar98._16_4_ = 0xa0;
        auVar98._20_4_ = 0xa0;
        auVar98._24_4_ = 0xa0;
        auVar98._28_4_ = 0xa0;
        local_5880 = vblendvps_avx(auVar98,auVar93,auVar82);
        auVar82 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar72);
        local_5b20 = vpmovsxwd_avx2(auVar9);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar115 = ZEXT3264(local_4680);
        local_5860 = vblendvps_avx(local_4680,auVar82,local_5b20);
        auVar82 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar72);
        auVar72._8_4_ = 0xff800000;
        auVar72._0_8_ = 0xff800000ff800000;
        auVar72._12_4_ = 0xff800000;
        auVar72._16_4_ = 0xff800000;
        auVar72._20_4_ = 0xff800000;
        auVar72._24_4_ = 0xff800000;
        auVar72._28_4_ = 0xff800000;
        local_5840 = vblendvps_avx(auVar72,auVar82,local_5b20);
        auVar71 = vpcmpeqd_avx(local_5840._0_16_,local_5840._0_16_);
        local_5ce0 = vpmovsxwd_avx2(auVar9 ^ auVar71);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar61 = 7;
        }
        else {
          uVar61 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5d00 = ray + 0x100;
        psVar56 = local_5808 + 1;
        local_5810 = 0xfffffffffffffff8;
        pauVar58 = (undefined1 (*) [32])local_4640;
        local_5808[0] = (bvh->root).ptr;
        local_4660 = local_5860;
        auVar82 = vpcmpeqd_avx2(auVar70,auVar70);
        auVar118 = ZEXT3264(auVar82);
        uStack_5904 = local_5a40._28_4_;
        uStack_58e4 = local_5a40._60_4_;
        uStack_58c4 = local_5a40._92_4_;
LAB_006907a8:
        pauVar58 = pauVar58 + -1;
        root.ptr = psVar56[-1];
        psVar56 = psVar56 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_00691092;
        local_5d20 = *pauVar58;
        auVar82 = vcmpps_avx(local_5d20,local_5840,1);
        if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar82 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar82 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar82 >> 0x7f,0) == '\0') &&
              (auVar82 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar82 >> 0xbf,0) == '\0') &&
            (auVar82 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar82[0x1f]) {
LAB_006910a3:
          iVar52 = 2;
        }
        else {
          uVar62 = vmovmskps_avx(auVar82);
          unaff_R15 = (RayK<8> *)CONCAT44((int)((ulong)unaff_R15 >> 0x20),uVar62);
          iVar52 = 0;
          if ((uint)POPCOUNT(uVar62) <= uVar61) {
            local_5d80._0_8_ = uVar61;
            while (unaff_R15 != (RayK<8> *)0x0) {
              k = 0;
              for (pRVar59 = unaff_R15; ((ulong)pRVar59 & 1) == 0;
                  pRVar59 = (RayK<8> *)((ulong)pRVar59 >> 1 | 0x8000000000000000)) {
                k = k + 1;
              }
              local_5d40._0_8_ = k;
              auVar82 = ZEXT1632(auVar118._0_16_);
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
              local_5cf8 = This;
              local_5cf0 = ray;
              local_5ce8 = context;
              bVar63 = occluded1(This,bvh,root,k,&local_5d81,ray,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,context);
              if (bVar63) {
                *(undefined4 *)(local_5ce0 + local_5d40._0_8_ * 4) = 0xffffffff;
              }
              unaff_R15 = (RayK<8> *)((ulong)(unaff_R15 + -1) & (ulong)unaff_R15);
              auVar115 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar82 = vpcmpeqd_avx2(auVar82,auVar82);
              auVar118 = ZEXT3264(auVar82);
              This = local_5cf8;
              ray = local_5cf0;
              context = local_5ce8;
            }
            auVar82 = auVar118._0_32_ & ~local_5ce0;
            iVar52 = 3;
            unaff_R15 = (RayK<8> *)0x0;
            uVar61 = local_5d80._0_8_;
            if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar82 >> 0x7f,0) != '\0') ||
                  (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar82 >> 0xbf,0) != '\0') ||
                (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar82[0x1f] < '\0') {
              auVar82._8_4_ = 0xff800000;
              auVar82._0_8_ = 0xff800000ff800000;
              auVar82._12_4_ = 0xff800000;
              auVar82._16_4_ = 0xff800000;
              auVar82._20_4_ = 0xff800000;
              auVar82._24_4_ = 0xff800000;
              auVar82._28_4_ = 0xff800000;
              local_5840 = vblendvps_avx(local_5840,auVar82,local_5ce0);
              iVar52 = 2;
            }
          }
          if ((uint)uVar61 < (uint)POPCOUNT(uVar62)) {
            unaff_R15 = (RayK<8> *)0x8;
            do {
              if ((root.ptr & 8) != 0) {
                if ((RayK<8> *)root.ptr == (RayK<8> *)&DAT_fffffffffffffff8) goto LAB_00691092;
                local_5b40 = local_5840;
                auVar82 = vcmpps_avx(local_5840,local_5d20,6);
                if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar82 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar82 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar82 >> 0x7f,0) == '\0') &&
                      (auVar82 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar82 >> 0xbf,0) == '\0') &&
                    (auVar82 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar82[0x1f]) goto LAB_006910a3;
                uVar53 = (ulong)((uint)root.ptr & 0xf);
                auVar70 = local_5ce0;
                if (uVar53 == 8) goto LAB_00691059;
                auVar79._0_4_ = auVar118._0_4_ ^ local_5ce0._0_4_;
                auVar79._4_4_ = auVar118._4_4_ ^ local_5ce0._4_4_;
                auVar79._8_4_ = auVar118._8_4_ ^ local_5ce0._8_4_;
                auVar79._12_4_ = auVar118._12_4_ ^ local_5ce0._12_4_;
                auVar79._16_4_ = auVar118._16_4_ ^ local_5ce0._16_4_;
                auVar79._20_4_ = auVar118._20_4_ ^ local_5ce0._20_4_;
                auVar79._24_4_ = auVar118._24_4_ ^ local_5ce0._24_4_;
                auVar79._28_4_ = auVar118._28_4_ ^ local_5ce0._28_4_;
                local_5b60 = *(undefined8 *)ray;
                uStack_5b58 = *(undefined8 *)(ray + 8);
                uStack_5b50 = *(undefined8 *)(ray + 0x10);
                uStack_5b48 = *(undefined8 *)(ray + 0x18);
                pRVar59 = ray + 0x20;
                local_5b80 = *(undefined8 *)pRVar59;
                uStack_5b78 = *(undefined8 *)(ray + 0x28);
                uStack_5b70 = *(undefined8 *)(ray + 0x30);
                uStack_5b68 = *(undefined8 *)(ray + 0x38);
                pRVar8 = ray + 0x40;
                local_5ba0 = *(undefined8 *)pRVar8;
                uStack_5b98 = *(undefined8 *)(ray + 0x48);
                uStack_5b90 = *(undefined8 *)(ray + 0x50);
                uStack_5b88 = *(undefined8 *)(ray + 0x58);
                uVar32 = *(undefined8 *)(ray + 0x60);
                uVar33 = *(undefined8 *)(ray + 0x68);
                uVar34 = *(undefined8 *)(ray + 0x70);
                uStack_5c28 = *(undefined8 *)(ray + 0x78);
                pRVar1 = ray + 0xa0;
                local_5bc0 = *(undefined8 *)pRVar1;
                uStack_5bb8 = *(undefined8 *)(ray + 0xa8);
                uStack_5bb0 = *(undefined8 *)(ray + 0xb0);
                auVar48 = *(undefined1 (*) [24])pRVar1;
                auVar47 = *(undefined1 (*) [24])pRVar1;
                uStack_5ba8 = *(undefined8 *)(ray + 0xb8);
                pRVar2 = ray + 0xc0;
                local_5be0 = *(undefined8 *)pRVar2;
                uStack_5bd8 = *(undefined8 *)(ray + 200);
                uStack_5bd0 = *(undefined8 *)(ray + 0xd0);
                auVar49 = *(undefined1 (*) [24])pRVar2;
                auVar45 = *(undefined1 (*) [24])pRVar2;
                uStack_5bc8 = *(undefined8 *)(ray + 0xd8);
                pRVar3 = ray + 0x80;
                local_5c00 = *(undefined8 *)pRVar3;
                uStack_5bf8 = *(undefined8 *)(ray + 0x88);
                uStack_5bf0 = *(undefined8 *)(ray + 0x90);
                auVar50 = *(undefined1 (*) [24])pRVar3;
                auVar46 = *(undefined1 (*) [24])pRVar3;
                uStack_5be8 = *(undefined8 *)(ray + 0x98);
                uVar35 = *(undefined8 *)(ray + 0x100);
                uVar36 = *(undefined8 *)(ray + 0x108);
                uVar37 = *(undefined8 *)(ray + 0x110);
                uStack_5c48 = *(undefined8 *)(ray + 0x118);
                pRVar4 = ray + 0x120;
                local_5c80 = *(undefined8 *)pRVar4;
                uStack_5c78 = *(undefined8 *)(ray + 0x128);
                uStack_5c70 = *(undefined8 *)(ray + 0x130);
                uStack_5c68 = *(undefined8 *)(ray + 0x138);
                lVar60 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar54 = 0;
                local_5d60 = local_5ce0;
                goto LAB_00690a8e;
              }
              auVar119 = ZEXT3264(auVar115._0_32_);
              uVar53 = 0;
              pRVar59 = unaff_R15;
              do {
                pRVar8 = *(RayK<8> **)((root.ptr & 0xfffffffffffffff0) + uVar53 * 8);
                if (pRVar8 != (RayK<8> *)0x8) {
                  uVar62 = *(undefined4 *)(root.ptr + uVar53 * 4 + 0x40);
                  auVar73._4_4_ = uVar62;
                  auVar73._0_4_ = uVar62;
                  auVar73._8_4_ = uVar62;
                  auVar73._12_4_ = uVar62;
                  auVar73._16_4_ = uVar62;
                  auVar73._20_4_ = uVar62;
                  auVar73._24_4_ = uVar62;
                  auVar73._28_4_ = uVar62;
                  auVar42._4_4_ = fStack_591c;
                  auVar42._0_4_ = local_5920;
                  auVar42._8_4_ = fStack_5918;
                  auVar42._12_4_ = fStack_5914;
                  auVar42._16_4_ = fStack_5910;
                  auVar42._20_4_ = fStack_590c;
                  auVar42._24_4_ = fStack_5908;
                  auVar42._28_4_ = uStack_5904;
                  uVar62 = *(undefined4 *)(root.ptr + uVar53 * 4 + 0x80);
                  auVar99._4_4_ = uVar62;
                  auVar99._0_4_ = uVar62;
                  auVar99._8_4_ = uVar62;
                  auVar99._12_4_ = uVar62;
                  auVar99._16_4_ = uVar62;
                  auVar99._20_4_ = uVar62;
                  auVar99._24_4_ = uVar62;
                  auVar99._28_4_ = uVar62;
                  auVar71 = vfmsub213ps_fma(auVar73,local_5980,auVar42);
                  auVar43._4_4_ = fStack_58fc;
                  auVar43._0_4_ = local_5900;
                  auVar43._8_4_ = fStack_58f8;
                  auVar43._12_4_ = fStack_58f4;
                  auVar43._16_4_ = fStack_58f0;
                  auVar43._20_4_ = fStack_58ec;
                  auVar43._24_4_ = fStack_58e8;
                  auVar43._28_4_ = uStack_58e4;
                  uVar62 = *(undefined4 *)(root.ptr + uVar53 * 4 + 0xc0);
                  auVar103._4_4_ = uVar62;
                  auVar103._0_4_ = uVar62;
                  auVar103._8_4_ = uVar62;
                  auVar103._12_4_ = uVar62;
                  auVar103._16_4_ = uVar62;
                  auVar103._20_4_ = uVar62;
                  auVar103._24_4_ = uVar62;
                  auVar103._28_4_ = uVar62;
                  auVar9 = vfmsub213ps_fma(auVar99,local_5960,auVar43);
                  auVar44._4_4_ = fStack_58dc;
                  auVar44._0_4_ = local_58e0;
                  auVar44._8_4_ = fStack_58d8;
                  auVar44._12_4_ = fStack_58d4;
                  auVar44._16_4_ = fStack_58d0;
                  auVar44._20_4_ = fStack_58cc;
                  auVar44._24_4_ = fStack_58c8;
                  auVar44._28_4_ = uStack_58c4;
                  uVar62 = *(undefined4 *)(root.ptr + uVar53 * 4 + 0x60);
                  auVar109._4_4_ = uVar62;
                  auVar109._0_4_ = uVar62;
                  auVar109._8_4_ = uVar62;
                  auVar109._12_4_ = uVar62;
                  auVar109._16_4_ = uVar62;
                  auVar109._20_4_ = uVar62;
                  auVar109._24_4_ = uVar62;
                  auVar109._28_4_ = uVar62;
                  auVar17 = vfmsub213ps_fma(auVar103,local_5940,auVar44);
                  auVar18 = vfmsub213ps_fma(auVar109,local_5980,auVar42);
                  uVar62 = *(undefined4 *)(root.ptr + uVar53 * 4 + 0xa0);
                  auVar94._4_4_ = uVar62;
                  auVar94._0_4_ = uVar62;
                  auVar94._8_4_ = uVar62;
                  auVar94._12_4_ = uVar62;
                  auVar94._16_4_ = uVar62;
                  auVar94._20_4_ = uVar62;
                  auVar94._24_4_ = uVar62;
                  auVar94._28_4_ = uVar62;
                  auVar19 = vfmsub213ps_fma(auVar94,local_5960,auVar43);
                  uVar62 = *(undefined4 *)(root.ptr + uVar53 * 4 + 0xe0);
                  auVar78._4_4_ = uVar62;
                  auVar78._0_4_ = uVar62;
                  auVar78._8_4_ = uVar62;
                  auVar78._12_4_ = uVar62;
                  auVar78._16_4_ = uVar62;
                  auVar78._20_4_ = uVar62;
                  auVar78._24_4_ = uVar62;
                  auVar78._28_4_ = uVar62;
                  auVar14 = vfmsub213ps_fma(auVar78,local_5940,auVar44);
                  auVar82 = vpminsd_avx2(ZEXT1632(auVar71),ZEXT1632(auVar18));
                  auVar72 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar19));
                  auVar82 = vpmaxsd_avx2(auVar82,auVar72);
                  auVar72 = vpminsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar14));
                  auVar72 = vpmaxsd_avx2(auVar82,auVar72);
                  auVar82 = vpmaxsd_avx2(ZEXT1632(auVar71),ZEXT1632(auVar18));
                  auVar70 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar19));
                  auVar70 = vpminsd_avx2(auVar82,auVar70);
                  auVar82 = vpmaxsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar14));
                  auVar70 = vpminsd_avx2(auVar70,auVar82);
                  auVar82 = vpmaxsd_avx2(auVar72,local_5860);
                  auVar70 = vpminsd_avx2(auVar70,local_5840);
                  auVar82 = vcmpps_avx(auVar82,auVar70,2);
                  if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar82 >> 0x7f,0) != '\0') ||
                        (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar82 >> 0xbf,0) != '\0') ||
                      (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar82[0x1f] < '\0') {
                    auVar82 = vblendvps_avx(auVar115._0_32_,auVar72,auVar82);
                    if (pRVar59 != (RayK<8> *)0x8) {
                      *psVar56 = (size_t)pRVar59;
                      psVar56 = psVar56 + 1;
                      *pauVar58 = auVar119._0_32_;
                      pauVar58 = pauVar58 + 1;
                    }
                    auVar119 = ZEXT3264(auVar82);
                    pRVar59 = pRVar8;
                  }
                }
                local_5d20 = auVar119._0_32_;
              } while ((pRVar8 != (RayK<8> *)0x8) &&
                      (bVar63 = uVar53 < 7, uVar53 = uVar53 + 1, bVar63));
              iVar52 = 0;
              if (pRVar59 == (RayK<8> *)0x8) {
LAB_0069098e:
                bVar63 = false;
                iVar52 = 4;
              }
              else {
                auVar82 = vcmpps_avx(local_5840,local_5d20,6);
                uVar62 = vmovmskps_avx(auVar82);
                bVar63 = true;
                if ((uint)POPCOUNT(uVar62) <= (uint)uVar61) {
                  *psVar56 = (size_t)pRVar59;
                  psVar56 = psVar56 + 1;
                  *pauVar58 = local_5d20;
                  pauVar58 = pauVar58 + 1;
                  goto LAB_0069098e;
                }
              }
              root.ptr = (size_t)pRVar59;
            } while (bVar63);
          }
        }
        goto LAB_00691095;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar54 = uVar54 + 1;
    lVar60 = lVar60 + 0xe0;
    if (uVar53 - 8 <= uVar54) break;
LAB_00690a8e:
    local_5d80 = auVar79;
    auVar119 = ZEXT3264(local_5d80);
    uVar55 = 0;
    while( true ) {
      auVar82 = auVar119._0_32_;
      uVar57 = (ulong)*(uint *)(lVar60 + uVar55 * 4);
      if (uVar57 == 0xffffffff) break;
      fVar5 = *(float *)(lVar60 + -0xc0 + uVar55 * 4);
      auVar95._4_4_ = fVar5;
      auVar95._0_4_ = fVar5;
      auVar95._8_4_ = fVar5;
      auVar95._12_4_ = fVar5;
      auVar95._16_4_ = fVar5;
      auVar95._20_4_ = fVar5;
      auVar95._24_4_ = fVar5;
      auVar95._28_4_ = fVar5;
      fVar6 = *(float *)(lVar60 + -0xb0 + uVar55 * 4);
      auVar102._4_4_ = fVar6;
      auVar102._0_4_ = fVar6;
      auVar102._8_4_ = fVar6;
      auVar102._12_4_ = fVar6;
      auVar102._16_4_ = fVar6;
      auVar102._20_4_ = fVar6;
      auVar102._24_4_ = fVar6;
      auVar102._28_4_ = fVar6;
      fVar7 = *(float *)(lVar60 + -0xa0 + uVar55 * 4);
      auVar104._4_4_ = fVar7;
      auVar104._0_4_ = fVar7;
      auVar104._8_4_ = fVar7;
      auVar104._12_4_ = fVar7;
      auVar104._16_4_ = fVar7;
      auVar104._20_4_ = fVar7;
      auVar104._24_4_ = fVar7;
      auVar104._28_4_ = fVar7;
      local_5ca0._4_4_ = *(float *)(lVar60 + -0x90 + uVar55 * 4);
      local_5cc0._4_4_ = *(float *)(lVar60 + -0x80 + uVar55 * 4);
      local_5a60 = *(float *)(lVar60 + -0x70 + uVar55 * 4);
      local_5a80 = *(float *)(lVar60 + -0x20 + uVar55 * 4);
      local_5aa0 = *(float *)(lVar60 + -0x10 + uVar55 * 4);
      local_5ca0._0_4_ = local_5ca0._4_4_;
      fStack_5c98 = (float)local_5ca0._4_4_;
      fStack_5c94 = (float)local_5ca0._4_4_;
      fStack_5c90 = (float)local_5ca0._4_4_;
      fStack_5c8c = (float)local_5ca0._4_4_;
      fStack_5c88 = (float)local_5ca0._4_4_;
      fStack_5c84 = (float)local_5ca0._4_4_;
      fVar10 = fVar5 - (float)local_5ca0._4_4_;
      local_5ae0._4_4_ = fVar10;
      local_5ae0._0_4_ = fVar10;
      local_5ae0._8_4_ = fVar10;
      local_5ae0._12_4_ = fVar10;
      local_5ae0._16_4_ = fVar10;
      local_5ae0._20_4_ = fVar10;
      local_5ae0._24_4_ = fVar10;
      local_5ae0._28_4_ = fVar10;
      local_5cc0._0_4_ = local_5cc0._4_4_;
      fStack_5cb8 = (float)local_5cc0._4_4_;
      fStack_5cb4 = (float)local_5cc0._4_4_;
      fStack_5cb0 = (float)local_5cc0._4_4_;
      fStack_5cac = (float)local_5cc0._4_4_;
      fStack_5ca8 = (float)local_5cc0._4_4_;
      fStack_5ca4 = (float)local_5cc0._4_4_;
      fVar11 = fVar6 - (float)local_5cc0._4_4_;
      fVar12 = fVar7 - local_5a60;
      local_5b00._4_4_ = fVar12;
      local_5b00._0_4_ = fVar12;
      local_5b00._8_4_ = fVar12;
      local_5b00._12_4_ = fVar12;
      local_5b00._16_4_ = fVar12;
      local_5b00._20_4_ = fVar12;
      local_5b00._24_4_ = fVar12;
      local_5b00._28_4_ = fVar12;
      fVar6 = local_5a80 - fVar6;
      auVar106._4_4_ = fVar6;
      auVar106._0_4_ = fVar6;
      auVar106._8_4_ = fVar6;
      auVar106._12_4_ = fVar6;
      auVar106._16_4_ = fVar6;
      auVar106._20_4_ = fVar6;
      auVar106._24_4_ = fVar6;
      auVar106._28_4_ = fVar6;
      fVar7 = local_5aa0 - fVar7;
      fVar6 = fVar6 * fVar10;
      auVar110._4_4_ = fVar7;
      auVar110._0_4_ = fVar7;
      auVar110._8_4_ = fVar7;
      auVar110._12_4_ = fVar7;
      auVar110._16_4_ = fVar7;
      auVar110._20_4_ = fVar7;
      auVar110._24_4_ = fVar7;
      auVar110._28_4_ = fVar7;
      fVar10 = fVar7 * fVar11;
      auVar117._4_4_ = fVar10;
      auVar117._0_4_ = fVar10;
      auVar117._8_4_ = fVar10;
      auVar117._12_4_ = fVar10;
      auVar117._16_4_ = fVar10;
      auVar117._20_4_ = fVar10;
      auVar117._24_4_ = fVar10;
      auVar117._28_4_ = fVar10;
      auVar17 = vfmsub231ps_fma(auVar117,auVar106,local_5b00);
      local_5ac0 = *(float *)(lVar60 + -0x30 + uVar55 * 4);
      fVar5 = local_5ac0 - fVar5;
      fVar10 = fVar5 * fVar12;
      auVar89._4_4_ = fVar10;
      auVar89._0_4_ = fVar10;
      auVar89._8_4_ = fVar10;
      auVar89._12_4_ = fVar10;
      auVar89._16_4_ = fVar10;
      auVar89._20_4_ = fVar10;
      auVar89._24_4_ = fVar10;
      auVar89._28_4_ = fVar10;
      auVar18 = vfmsub231ps_fma(auVar89,auVar110,local_5ae0);
      auVar70 = vsubps_avx(auVar95,*(undefined1 (*) [32])ray);
      uVar13 = auVar70._28_4_;
      auVar120 = ZEXT436(uVar13);
      auVar91 = vsubps_avx(auVar102,*(undefined1 (*) [32])pRVar59);
      auVar123 = ZEXT436(auVar91._28_4_);
      auVar92 = vsubps_avx(auVar104,*(undefined1 (*) [32])pRVar8);
      auVar115._0_4_ = auVar70._0_4_ * auVar45._0_4_;
      auVar115._4_4_ = auVar70._4_4_ * auVar45._4_4_;
      auVar115._8_4_ = auVar70._8_4_ * auVar45._8_4_;
      auVar115._12_4_ = auVar70._12_4_ * auVar45._12_4_;
      auVar115._16_4_ = auVar70._16_4_ * auVar45._16_4_;
      auVar115._20_4_ = auVar70._20_4_ * auVar45._20_4_;
      fVar10 = (float)uStack_5bc8;
      auVar115._28_36_ = in_ZMM13._28_36_;
      auVar115._24_4_ = auVar70._24_4_ * fVar10;
      auVar15 = vfmsub231ps_fma(auVar115._0_32_,auVar92,*(undefined1 (*) [32])pRVar3);
      auVar118._0_4_ = auVar91._0_4_ * auVar46._0_4_;
      auVar118._4_4_ = auVar91._4_4_ * auVar46._4_4_;
      auVar118._8_4_ = auVar91._8_4_ * auVar46._8_4_;
      auVar118._12_4_ = auVar91._12_4_ * auVar46._12_4_;
      auVar118._16_4_ = auVar91._16_4_ * auVar46._16_4_;
      auVar118._20_4_ = auVar91._20_4_ * auVar46._20_4_;
      auVar118._28_36_ = in_ZMM15._28_36_;
      auVar118._24_4_ = auVar91._24_4_ * (float)uStack_5be8;
      auVar19 = vfmsub231ps_fma(auVar118._0_32_,auVar70,*(undefined1 (*) [32])pRVar1);
      in_ZMM15 = ZEXT1664(auVar19);
      auVar20._4_4_ = fVar7 * auVar19._4_4_;
      auVar20._0_4_ = fVar7 * auVar19._0_4_;
      auVar20._8_4_ = fVar7 * auVar19._8_4_;
      auVar20._12_4_ = fVar7 * auVar19._12_4_;
      auVar20._16_4_ = fVar7 * 0.0;
      auVar20._20_4_ = fVar7 * 0.0;
      auVar20._24_4_ = fVar7 * 0.0;
      auVar20._28_4_ = local_5ac0;
      auVar71 = vfmadd231ps_fma(auVar20,ZEXT1632(auVar15),auVar106);
      auVar100._4_4_ = fVar11;
      auVar100._0_4_ = fVar11;
      auVar100._8_4_ = fVar11;
      auVar100._12_4_ = fVar11;
      auVar100._16_4_ = fVar11;
      auVar100._20_4_ = fVar11;
      auVar100._24_4_ = fVar11;
      auVar100._28_4_ = fVar11;
      auVar64._4_4_ = fVar5;
      auVar64._0_4_ = fVar5;
      auVar64._8_4_ = fVar5;
      auVar64._12_4_ = fVar5;
      auVar64._16_4_ = fVar5;
      auVar64._20_4_ = fVar5;
      auVar64._24_4_ = fVar5;
      auVar64._28_4_ = fVar5;
      auVar107._4_4_ = fVar6;
      auVar107._0_4_ = fVar6;
      auVar107._8_4_ = fVar6;
      auVar107._12_4_ = fVar6;
      auVar107._16_4_ = fVar6;
      auVar107._20_4_ = fVar6;
      auVar107._24_4_ = fVar6;
      auVar107._28_4_ = fVar6;
      auVar14 = vfmsub231ps_fma(auVar107,auVar64,auVar100);
      auVar21._4_4_ = auVar47._4_4_ * auVar92._4_4_;
      auVar21._0_4_ = auVar47._0_4_ * auVar92._0_4_;
      auVar21._8_4_ = auVar47._8_4_ * auVar92._8_4_;
      auVar21._12_4_ = auVar47._12_4_ * auVar92._12_4_;
      auVar21._16_4_ = auVar47._16_4_ * auVar92._16_4_;
      auVar21._20_4_ = auVar47._20_4_ * auVar92._20_4_;
      auVar21._24_4_ = (float)uStack_5ba8 * auVar92._24_4_;
      auVar21._28_4_ = fVar7;
      auVar16 = vfmsub231ps_fma(auVar21,auVar91,*(undefined1 (*) [32])pRVar2);
      auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),ZEXT1632(auVar16),auVar64);
      auVar22._4_4_ = auVar14._4_4_ * auVar45._4_4_;
      auVar22._0_4_ = auVar14._0_4_ * auVar45._0_4_;
      auVar22._8_4_ = auVar14._8_4_ * auVar45._8_4_;
      auVar22._12_4_ = auVar14._12_4_ * auVar45._12_4_;
      auVar22._16_4_ = auVar45._16_4_ * 0.0;
      auVar22._20_4_ = auVar45._20_4_ * 0.0;
      auVar22._24_4_ = fVar10 * 0.0;
      auVar22._28_4_ = (int)((ulong)uStack_5bc8 >> 0x20);
      auVar9 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar18),*(undefined1 (*) [32])pRVar1);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar17),*(undefined1 (*) [32])pRVar3);
      auVar119 = ZEXT3264(auVar82);
      auVar65._8_4_ = 0x80000000;
      auVar65._0_8_ = 0x8000000080000000;
      auVar65._12_4_ = 0x80000000;
      auVar65._16_4_ = 0x80000000;
      auVar65._20_4_ = 0x80000000;
      auVar65._24_4_ = 0x80000000;
      auVar65._28_4_ = 0x80000000;
      auVar72 = vandps_avx(ZEXT1632(auVar9),auVar65);
      uVar77 = auVar72._0_4_;
      auVar114._0_4_ = uVar77 ^ auVar71._0_4_;
      uVar83 = auVar72._4_4_;
      auVar114._4_4_ = uVar83 ^ auVar71._4_4_;
      uVar84 = auVar72._8_4_;
      auVar114._8_4_ = uVar84 ^ auVar71._8_4_;
      uVar85 = auVar72._12_4_;
      auVar114._12_4_ = uVar85 ^ auVar71._12_4_;
      uVar62 = auVar72._16_4_;
      auVar114._16_4_ = uVar62;
      uVar86 = auVar72._20_4_;
      auVar114._20_4_ = uVar86;
      uVar87 = auVar72._24_4_;
      auVar114._24_4_ = uVar87;
      uVar88 = auVar72._28_4_;
      auVar114._28_4_ = uVar88;
      auVar72 = vcmpps_avx(auVar114,_DAT_02020f00,5);
      auVar93 = auVar82 & auVar72;
      auVar97 = ZEXT1632(auVar17);
      local_5c40._0_4_ = (float)uVar32;
      local_5c40._4_4_ = (float)((ulong)uVar32 >> 0x20);
      uStack_5c38._0_4_ = (float)uVar33;
      uStack_5c38._4_4_ = (float)((ulong)uVar33 >> 0x20);
      uStack_5c30._0_4_ = (float)uVar34;
      uStack_5c30._4_4_ = (float)((ulong)uVar34 >> 0x20);
      local_5c60._0_4_ = (float)uVar35;
      local_5c60._4_4_ = (float)((ulong)uVar35 >> 0x20);
      uStack_5c58._0_4_ = (float)uVar36;
      uStack_5c58._4_4_ = (float)((ulong)uVar36 >> 0x20);
      uStack_5c50._0_4_ = (float)uVar37;
      uStack_5c50._4_4_ = (float)((ulong)uVar37 >> 0x20);
      auVar51 = ZEXT436(uVar13);
      if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar93 >> 0x7f,0) == '\0') &&
            (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar93 >> 0xbf,0) == '\0') &&
          (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar93[0x1f])
      {
LAB_00690c56:
        auVar120 = auVar51;
        auVar72 = vpcmpeqd_avx2(auVar97,auVar97);
      }
      else {
        auVar93 = vandps_avx(auVar72,auVar82);
        auVar28._4_4_ = auVar19._4_4_ * fVar12;
        auVar28._0_4_ = auVar19._0_4_ * fVar12;
        auVar28._8_4_ = auVar19._8_4_ * fVar12;
        auVar28._12_4_ = auVar19._12_4_ * fVar12;
        auVar28._16_4_ = fVar12 * 0.0;
        auVar28._20_4_ = fVar12 * 0.0;
        auVar28._24_4_ = fVar12 * 0.0;
        auVar28._28_4_ = auVar72._28_4_;
        auVar71 = vfmadd213ps_fma(auVar100,ZEXT1632(auVar15),auVar28);
        auVar71 = vfmadd213ps_fma(local_5ae0,ZEXT1632(auVar16),ZEXT1632(auVar71));
        auVar112._0_4_ = uVar77 ^ auVar71._0_4_;
        auVar112._4_4_ = uVar83 ^ auVar71._4_4_;
        auVar112._8_4_ = uVar84 ^ auVar71._8_4_;
        auVar112._12_4_ = uVar85 ^ auVar71._12_4_;
        auVar112._16_4_ = uVar62;
        auVar112._20_4_ = uVar86;
        auVar112._24_4_ = uVar87;
        auVar112._28_4_ = uVar88;
        auVar72 = vcmpps_avx(auVar112,_DAT_02020f00,5);
        auVar98 = auVar93 & auVar72;
        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar98 >> 0x7f,0) == '\0') &&
              (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0xbf,0) == '\0') &&
            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar98[0x1f]) goto LAB_00690c56;
        auVar98 = vandps_avx(ZEXT1632(auVar9),local_5c20);
        auVar72 = vandps_avx(auVar72,auVar93);
        auVar93 = vsubps_avx(auVar98,auVar114);
        auVar93 = vcmpps_avx(auVar93,auVar112,5);
        auVar113 = auVar72 & auVar93;
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0x7f,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar113 >> 0xbf,0) != '\0') ||
            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar113[0x1f] < '\0') {
          auVar72 = vandps_avx(auVar93,auVar72);
          auVar30._4_4_ = auVar14._4_4_ * auVar92._4_4_;
          auVar30._0_4_ = auVar14._0_4_ * auVar92._0_4_;
          auVar30._8_4_ = auVar14._8_4_ * auVar92._8_4_;
          auVar30._12_4_ = auVar14._12_4_ * auVar92._12_4_;
          auVar30._16_4_ = auVar92._16_4_ * 0.0;
          auVar30._20_4_ = auVar92._20_4_ * 0.0;
          auVar30._24_4_ = auVar92._24_4_ * 0.0;
          auVar30._28_4_ = auVar93._28_4_;
          auVar71 = vfmadd213ps_fma(auVar91,ZEXT1632(auVar18),auVar30);
          auVar123 = (undefined1  [36])0x0;
          auVar71 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar17),ZEXT1632(auVar71));
          auVar120 = (undefined1  [36])0x0;
          auVar67._0_4_ = auVar71._0_4_ ^ uVar77;
          auVar67._4_4_ = auVar71._4_4_ ^ uVar83;
          auVar67._8_4_ = auVar71._8_4_ ^ uVar84;
          auVar67._12_4_ = auVar71._12_4_ ^ uVar85;
          auVar67._16_4_ = uVar62;
          auVar67._20_4_ = uVar86;
          auVar67._24_4_ = uVar87;
          auVar67._28_4_ = uVar88;
          auVar90._0_4_ = auVar98._0_4_ * (float)local_5c40;
          auVar90._4_4_ = auVar98._4_4_ * local_5c40._4_4_;
          auVar90._8_4_ = auVar98._8_4_ * (float)uStack_5c38;
          auVar90._12_4_ = auVar98._12_4_ * uStack_5c38._4_4_;
          auVar90._16_4_ = auVar98._16_4_ * (float)uStack_5c30;
          auVar90._20_4_ = auVar98._20_4_ * uStack_5c30._4_4_;
          auVar90._24_4_ = auVar98._24_4_ * (float)uStack_5c28;
          auVar90._28_4_ = 0;
          auVar70 = vcmpps_avx(auVar90,auVar67,1);
          auVar31._4_4_ = auVar98._4_4_ * local_5c60._4_4_;
          auVar31._0_4_ = auVar98._0_4_ * (float)local_5c60;
          auVar31._8_4_ = auVar98._8_4_ * (float)uStack_5c58;
          auVar31._12_4_ = auVar98._12_4_ * uStack_5c58._4_4_;
          auVar31._16_4_ = auVar98._16_4_ * (float)uStack_5c50;
          auVar31._20_4_ = auVar98._20_4_ * uStack_5c50._4_4_;
          auVar31._24_4_ = auVar98._24_4_ * (float)uStack_5c48;
          auVar31._28_4_ = auVar98._28_4_;
          auVar91 = vcmpps_avx(auVar67,auVar31,2);
          auVar70 = vandps_avx(auVar91,auVar70);
          auVar91 = auVar72 & auVar70;
          if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar91 >> 0x7f,0) != '\0') ||
                (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar91 >> 0xbf,0) != '\0') ||
              (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar91[0x1f] < '\0') {
            auVar72 = vandps_avx(auVar70,auVar72);
            auVar70 = vcmpps_avx(ZEXT1632(auVar9),_DAT_02020f00,4);
            auVar91 = auVar72 & auVar70;
            if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar91 >> 0x7f,0) != '\0') ||
                  (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar91 >> 0xbf,0) != '\0') ||
                (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar91[0x1f] < '\0') {
              uVar13 = ((context->scene->geometries).items[uVar57].ptr)->mask;
              auVar68._4_4_ = uVar13;
              auVar68._0_4_ = uVar13;
              auVar68._8_4_ = uVar13;
              auVar68._12_4_ = uVar13;
              auVar68._16_4_ = uVar13;
              auVar68._20_4_ = uVar13;
              auVar68._24_4_ = uVar13;
              auVar68._28_4_ = uVar13;
              auVar72 = vandps_avx(auVar70,auVar72);
              auVar70 = vpand_avx2(auVar68,*(undefined1 (*) [32])pRVar4);
              auVar91 = vpcmpeqd_avx2(auVar70,_DAT_02020f00);
              auVar70 = auVar72 & ~auVar91;
              if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar70 >> 0x7f,0) != '\0') ||
                    (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar70 >> 0xbf,0) != '\0') ||
                  (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar70[0x1f] < '\0') {
                auVar72 = vandnps_avx(auVar91,auVar72);
                auVar72 = vandnps_avx(auVar72,auVar82);
                auVar119 = ZEXT3264(auVar72);
                auVar51 = (undefined1  [36])0x0;
                goto LAB_00690c56;
              }
            }
          }
        }
        auVar72 = vpcmpeqd_avx2(auVar97,auVar97);
        auVar119 = ZEXT3264(auVar82);
      }
      auVar70 = auVar119._0_32_;
      if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar70 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar70 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar70 >> 0x7f,0) == '\0') &&
            (auVar119 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar70 >> 0xbf,0) == '\0') &&
          (auVar119 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar119[0x1f]) {
        bVar63 = false;
        local_5d40 = auVar82;
      }
      else {
        uVar62 = *(undefined4 *)(lVar60 + -0x60 + uVar55 * 4);
        auVar66._4_4_ = uVar62;
        auVar66._0_4_ = uVar62;
        auVar66._8_4_ = uVar62;
        auVar66._12_4_ = uVar62;
        auVar66._16_4_ = uVar62;
        auVar66._20_4_ = uVar62;
        auVar66._24_4_ = uVar62;
        auVar66._28_4_ = uVar62;
        uVar62 = *(undefined4 *)(lVar60 + -0x50 + uVar55 * 4);
        auVar101._4_4_ = uVar62;
        auVar101._0_4_ = uVar62;
        auVar101._8_4_ = uVar62;
        auVar101._12_4_ = uVar62;
        auVar101._16_4_ = uVar62;
        auVar101._20_4_ = uVar62;
        auVar101._24_4_ = uVar62;
        auVar101._28_4_ = uVar62;
        uVar62 = *(undefined4 *)(lVar60 + -0x40 + uVar55 * 4);
        auVar111._4_4_ = uVar62;
        auVar111._0_4_ = uVar62;
        auVar111._8_4_ = uVar62;
        auVar111._12_4_ = uVar62;
        auVar111._16_4_ = uVar62;
        auVar111._20_4_ = uVar62;
        auVar111._24_4_ = uVar62;
        auVar111._28_4_ = uVar62;
        auVar38._4_4_ = local_5ac0;
        auVar38._0_4_ = local_5ac0;
        auVar38._8_4_ = local_5ac0;
        auVar38._12_4_ = local_5ac0;
        auVar38._16_4_ = local_5ac0;
        auVar38._20_4_ = local_5ac0;
        auVar38._24_4_ = local_5ac0;
        auVar38._28_4_ = local_5ac0;
        local_5d40 = vsubps_avx(auVar66,auVar38);
        auVar40._4_4_ = local_5a80;
        auVar40._0_4_ = local_5a80;
        auVar40._8_4_ = local_5a80;
        auVar40._12_4_ = local_5a80;
        auVar40._16_4_ = local_5a80;
        auVar40._20_4_ = local_5a80;
        auVar40._24_4_ = local_5a80;
        auVar40._28_4_ = local_5a80;
        auVar91 = vsubps_avx(auVar101,auVar40);
        auVar39._4_4_ = local_5aa0;
        auVar39._0_4_ = local_5aa0;
        auVar39._8_4_ = local_5aa0;
        auVar39._12_4_ = local_5aa0;
        auVar39._16_4_ = local_5aa0;
        auVar39._20_4_ = local_5aa0;
        auVar39._24_4_ = local_5aa0;
        auVar39._28_4_ = local_5aa0;
        auVar93 = vsubps_avx(auVar111,auVar39);
        auVar72 = vsubps_avx(_local_5ca0,auVar66);
        auVar82 = vsubps_avx(_local_5cc0,auVar101);
        auVar41._4_4_ = local_5a60;
        auVar41._0_4_ = local_5a60;
        auVar41._8_4_ = local_5a60;
        auVar41._12_4_ = local_5a60;
        auVar41._16_4_ = local_5a60;
        auVar41._20_4_ = local_5a60;
        auVar41._24_4_ = local_5a60;
        auVar41._28_4_ = local_5a60;
        auVar97 = vsubps_avx(auVar41,auVar111);
        auVar23._4_4_ = auVar97._4_4_ * auVar91._4_4_;
        auVar23._0_4_ = auVar97._0_4_ * auVar91._0_4_;
        auVar23._8_4_ = auVar97._8_4_ * auVar91._8_4_;
        auVar23._12_4_ = auVar97._12_4_ * auVar91._12_4_;
        auVar23._16_4_ = auVar97._16_4_ * auVar91._16_4_;
        auVar23._20_4_ = auVar97._20_4_ * auVar91._20_4_;
        auVar23._24_4_ = auVar97._24_4_ * auVar91._24_4_;
        auVar23._28_4_ = local_5a60;
        auVar17 = vfmsub231ps_fma(auVar23,auVar82,auVar93);
        auVar24._4_4_ = auVar72._4_4_ * auVar93._4_4_;
        auVar24._0_4_ = auVar72._0_4_ * auVar93._0_4_;
        auVar24._8_4_ = auVar72._8_4_ * auVar93._8_4_;
        auVar24._12_4_ = auVar72._12_4_ * auVar93._12_4_;
        auVar24._16_4_ = auVar72._16_4_ * auVar93._16_4_;
        auVar24._20_4_ = auVar72._20_4_ * auVar93._20_4_;
        auVar24._24_4_ = auVar72._24_4_ * auVar93._24_4_;
        auVar24._28_4_ = auVar93._28_4_;
        auVar18 = vfmsub231ps_fma(auVar24,auVar97,local_5d40);
        auVar25._4_4_ = auVar82._4_4_ * local_5d40._4_4_;
        auVar25._0_4_ = auVar82._0_4_ * local_5d40._0_4_;
        auVar25._8_4_ = auVar82._8_4_ * local_5d40._8_4_;
        auVar25._12_4_ = auVar82._12_4_ * local_5d40._12_4_;
        auVar25._16_4_ = auVar82._16_4_ * local_5d40._16_4_;
        auVar25._20_4_ = auVar82._20_4_ * local_5d40._20_4_;
        auVar25._24_4_ = auVar82._24_4_ * local_5d40._24_4_;
        auVar25._28_4_ = auVar92._28_4_;
        auVar19 = vfmsub231ps_fma(auVar25,auVar72,auVar91);
        auVar92 = vsubps_avx(auVar66,*(undefined1 (*) [32])ray);
        auVar98 = vsubps_avx(auVar101,*(undefined1 (*) [32])pRVar59);
        auVar113 = vsubps_avx(auVar111,*(undefined1 (*) [32])pRVar8);
        auVar119._0_4_ = auVar113._0_4_ * auVar48._0_4_;
        auVar119._4_4_ = auVar113._4_4_ * auVar48._4_4_;
        auVar119._8_4_ = auVar113._8_4_ * auVar48._8_4_;
        auVar119._12_4_ = auVar113._12_4_ * auVar48._12_4_;
        auVar119._16_4_ = auVar113._16_4_ * auVar48._16_4_;
        auVar119._20_4_ = auVar113._20_4_ * auVar48._20_4_;
        auVar119._24_4_ = auVar113._24_4_ * (float)uStack_5ba8;
        auVar119._28_36_ = auVar120;
        auVar14 = vfmsub231ps_fma(auVar119._0_32_,auVar98,*(undefined1 (*) [32])pRVar2);
        auVar121._0_4_ = auVar92._0_4_ * auVar49._0_4_;
        auVar121._4_4_ = auVar92._4_4_ * auVar49._4_4_;
        auVar121._8_4_ = auVar92._8_4_ * auVar49._8_4_;
        auVar121._12_4_ = auVar92._12_4_ * auVar49._12_4_;
        auVar121._16_4_ = auVar92._16_4_ * auVar49._16_4_;
        auVar121._20_4_ = auVar92._20_4_ * auVar49._20_4_;
        auVar121._24_4_ = auVar92._24_4_ * fVar10;
        auVar121._28_4_ = 0;
        auVar15 = vfmsub231ps_fma(auVar121,auVar113,*(undefined1 (*) [32])pRVar3);
        auVar122._0_4_ = auVar50._0_4_ * auVar98._0_4_;
        auVar122._4_4_ = auVar50._4_4_ * auVar98._4_4_;
        auVar122._8_4_ = auVar50._8_4_ * auVar98._8_4_;
        auVar122._12_4_ = auVar50._12_4_ * auVar98._12_4_;
        auVar122._16_4_ = auVar50._16_4_ * auVar98._16_4_;
        auVar122._20_4_ = auVar50._20_4_ * auVar98._20_4_;
        auVar122._24_4_ = (float)uStack_5be8 * auVar98._24_4_;
        auVar122._28_36_ = auVar123;
        auVar16 = vfmsub231ps_fma(auVar122._0_32_,auVar92,*(undefined1 (*) [32])pRVar1);
        auVar26._4_4_ = auVar97._4_4_ * auVar16._4_4_;
        auVar26._0_4_ = auVar97._0_4_ * auVar16._0_4_;
        auVar26._8_4_ = auVar97._8_4_ * auVar16._8_4_;
        auVar26._12_4_ = auVar97._12_4_ * auVar16._12_4_;
        auVar26._16_4_ = auVar97._16_4_ * 0.0;
        auVar26._20_4_ = auVar97._20_4_ * 0.0;
        auVar26._24_4_ = auVar97._24_4_ * 0.0;
        auVar26._28_4_ = auVar97._28_4_;
        auVar71 = vfmadd231ps_fma(auVar26,ZEXT1632(auVar15),auVar82);
        auVar27._4_4_ = auVar19._4_4_ * auVar49._4_4_;
        auVar27._0_4_ = auVar19._0_4_ * auVar49._0_4_;
        auVar27._8_4_ = auVar19._8_4_ * auVar49._8_4_;
        auVar27._12_4_ = auVar19._12_4_ * auVar49._12_4_;
        auVar27._16_4_ = auVar49._16_4_ * 0.0;
        auVar27._20_4_ = auVar49._20_4_ * 0.0;
        auVar27._24_4_ = fVar10 * 0.0;
        auVar27._28_4_ = auVar82._28_4_;
        auVar9 = vfmadd231ps_fma(auVar27,ZEXT1632(auVar18),*(undefined1 (*) [32])pRVar1);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar17),*(undefined1 (*) [32])pRVar3);
        auVar82 = vandps_avx(ZEXT1632(auVar9),auVar65);
        auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),ZEXT1632(auVar14),auVar72);
        uVar13 = auVar82._0_4_;
        auVar108._0_4_ = auVar71._0_4_ ^ uVar13;
        uVar77 = auVar82._4_4_;
        auVar108._4_4_ = auVar71._4_4_ ^ uVar77;
        uVar83 = auVar82._8_4_;
        auVar108._8_4_ = auVar71._8_4_ ^ uVar83;
        uVar84 = auVar82._12_4_;
        auVar108._12_4_ = auVar71._12_4_ ^ uVar84;
        uVar62 = auVar82._16_4_;
        auVar108._16_4_ = uVar62;
        uVar86 = auVar82._20_4_;
        auVar108._20_4_ = uVar86;
        uVar87 = auVar82._24_4_;
        auVar108._24_4_ = uVar87;
        uVar88 = auVar82._28_4_;
        auVar108._28_4_ = uVar88;
        auVar82 = vcmpps_avx(auVar108,_DAT_02020f00,5);
        in_ZMM15 = ZEXT3264(auVar82);
        auVar72 = auVar70 & auVar82;
        auVar97 = ZEXT1632(auVar9);
        if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar72 >> 0x7f,0) != '\0') ||
              (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar72 >> 0xbf,0) != '\0') ||
            (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar72[0x1f] < '\0') {
          auVar82 = vandps_avx(auVar82,auVar70);
          in_ZMM15 = ZEXT3264(auVar82);
          auVar29._4_4_ = auVar16._4_4_ * auVar93._4_4_;
          auVar29._0_4_ = auVar16._0_4_ * auVar93._0_4_;
          auVar29._8_4_ = auVar16._8_4_ * auVar93._8_4_;
          auVar29._12_4_ = auVar16._12_4_ * auVar93._12_4_;
          auVar29._16_4_ = auVar93._16_4_ * 0.0;
          auVar29._20_4_ = auVar93._20_4_ * 0.0;
          auVar29._24_4_ = auVar93._24_4_ * 0.0;
          auVar29._28_4_ = auVar98._28_4_;
          auVar71 = vfmadd213ps_fma(auVar91,ZEXT1632(auVar15),auVar29);
          auVar71 = vfmadd213ps_fma(local_5d40,ZEXT1632(auVar14),ZEXT1632(auVar71));
          auVar105._0_4_ = uVar13 ^ auVar71._0_4_;
          auVar105._4_4_ = uVar77 ^ auVar71._4_4_;
          auVar105._8_4_ = uVar83 ^ auVar71._8_4_;
          auVar105._12_4_ = uVar84 ^ auVar71._12_4_;
          auVar105._16_4_ = uVar62;
          auVar105._20_4_ = uVar86;
          auVar105._24_4_ = uVar87;
          auVar105._28_4_ = uVar88;
          auVar72 = vcmpps_avx(auVar105,_DAT_02020f00,5);
          auVar116 = auVar82 & auVar72;
          if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar116 >> 0x7f,0) != '\0') ||
                (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar116 >> 0xbf,0) != '\0') ||
              (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar116[0x1f] < '\0') {
            auVar116 = vandps_avx(ZEXT1632(auVar9),local_5c20);
            auVar82 = vandps_avx(auVar72,auVar82);
            auVar72 = vsubps_avx(auVar116,auVar108);
            auVar72 = vcmpps_avx(auVar72,auVar105,5);
            auVar79 = auVar82 & auVar72;
            if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar79 >> 0x7f,0) != '\0') ||
                  (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar79 >> 0xbf,0) != '\0') ||
                (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar79[0x1f] < '\0') {
              auVar82 = vandps_avx(auVar82,auVar72);
              auVar96._0_4_ = auVar113._0_4_ * auVar19._0_4_;
              auVar96._4_4_ = auVar113._4_4_ * auVar19._4_4_;
              auVar96._8_4_ = auVar113._8_4_ * auVar19._8_4_;
              auVar96._12_4_ = auVar113._12_4_ * auVar19._12_4_;
              auVar96._16_4_ = auVar113._16_4_ * 0.0;
              auVar96._20_4_ = auVar113._20_4_ * 0.0;
              auVar96._24_4_ = auVar113._24_4_ * 0.0;
              auVar96._28_4_ = 0;
              auVar71 = vfmadd213ps_fma(auVar98,ZEXT1632(auVar18),auVar96);
              auVar71 = vfmadd213ps_fma(auVar92,ZEXT1632(auVar17),ZEXT1632(auVar71));
              auVar69._0_4_ = uVar13 ^ auVar71._0_4_;
              auVar69._4_4_ = uVar77 ^ auVar71._4_4_;
              auVar69._8_4_ = uVar83 ^ auVar71._8_4_;
              auVar69._12_4_ = uVar84 ^ auVar71._12_4_;
              auVar69._16_4_ = uVar62;
              auVar69._20_4_ = uVar86;
              auVar69._24_4_ = uVar87;
              auVar69._28_4_ = uVar88;
              auVar74._0_4_ = auVar116._0_4_ * (float)local_5c40;
              auVar74._4_4_ = auVar116._4_4_ * local_5c40._4_4_;
              auVar74._8_4_ = auVar116._8_4_ * (float)uStack_5c38;
              auVar74._12_4_ = auVar116._12_4_ * uStack_5c38._4_4_;
              auVar74._16_4_ = auVar116._16_4_ * (float)uStack_5c30;
              auVar74._20_4_ = auVar116._20_4_ * uStack_5c30._4_4_;
              auVar74._24_4_ = auVar116._24_4_ * (float)uStack_5c28;
              auVar74._28_4_ = 0;
              auVar72 = vcmpps_avx(auVar74,auVar69,1);
              auVar80._0_4_ = auVar116._0_4_ * (float)local_5c60;
              auVar80._4_4_ = auVar116._4_4_ * local_5c60._4_4_;
              auVar80._8_4_ = auVar116._8_4_ * (float)uStack_5c58;
              auVar80._12_4_ = auVar116._12_4_ * uStack_5c58._4_4_;
              auVar80._16_4_ = auVar116._16_4_ * (float)uStack_5c50;
              auVar80._20_4_ = auVar116._20_4_ * uStack_5c50._4_4_;
              auVar80._24_4_ = auVar116._24_4_ * (float)uStack_5c48;
              auVar80._28_4_ = 0;
              auVar92 = vcmpps_avx(auVar69,auVar80,2);
              auVar72 = vandps_avx(auVar92,auVar72);
              auVar92 = auVar82 & auVar72;
              if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar92 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar92 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar92 >> 0x7f,0) != '\0') ||
                    (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar92 >> 0xbf,0) != '\0') ||
                  (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar92[0x1f] < '\0') {
                auVar82 = vandps_avx(auVar72,auVar82);
                auVar72 = vcmpps_avx(auVar97,_DAT_02020f00,4);
                auVar92 = auVar82 & auVar72;
                if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar92 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar92 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar92 >> 0x7f,0) != '\0') ||
                      (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar92 >> 0xbf,0) != '\0') ||
                    (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar92[0x1f] < '\0') {
                  uVar13 = ((context->scene->geometries).items[uVar57].ptr)->mask;
                  auVar81._4_4_ = uVar13;
                  auVar81._0_4_ = uVar13;
                  auVar81._8_4_ = uVar13;
                  auVar81._12_4_ = uVar13;
                  auVar81._16_4_ = uVar13;
                  auVar81._20_4_ = uVar13;
                  auVar81._24_4_ = uVar13;
                  auVar81._28_4_ = uVar13;
                  auVar82 = vandps_avx(auVar72,auVar82);
                  auVar72 = vpand_avx2(auVar81,*(undefined1 (*) [32])pRVar4);
                  auVar92 = vpcmpeqd_avx2(auVar72,_DAT_02020f00);
                  auVar72 = auVar82 & ~auVar92;
                  if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar72 >> 0x7f,0) != '\0') ||
                        (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar72 >> 0xbf,0) != '\0') ||
                      (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar72[0x1f] < '\0') {
                    auVar82 = vandnps_avx(auVar92,auVar82);
                    auVar70 = vandnps_avx(auVar82,auVar70);
                  }
                }
              }
            }
          }
        }
        auVar72 = vpcmpeqd_avx2(auVar97,auVar97);
        auVar119 = ZEXT3264(auVar70);
        bVar63 = (((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar70 >> 0x7f,0) != '\0') ||
                   (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar70 >> 0xbf,0) != '\0') ||
                 (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar70[0x1f] < '\0';
        _local_5cc0 = auVar93;
        _local_5ca0 = auVar91;
      }
      auVar82 = auVar119._0_32_;
      in_ZMM13 = ZEXT1664(auVar15);
      auVar118 = ZEXT3264(auVar72);
      auVar115 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      fStack_5abc = local_5ac0;
      fStack_5ab8 = local_5ac0;
      fStack_5ab4 = local_5ac0;
      fStack_5ab0 = local_5ac0;
      fStack_5aac = local_5ac0;
      fStack_5aa8 = local_5ac0;
      fStack_5aa4 = local_5ac0;
      fStack_5a9c = local_5aa0;
      fStack_5a98 = local_5aa0;
      fStack_5a94 = local_5aa0;
      fStack_5a90 = local_5aa0;
      fStack_5a8c = local_5aa0;
      fStack_5a88 = local_5aa0;
      fStack_5a84 = local_5aa0;
      fStack_5a7c = local_5a80;
      fStack_5a78 = local_5a80;
      fStack_5a74 = local_5a80;
      fStack_5a70 = local_5a80;
      fStack_5a6c = local_5a80;
      fStack_5a68 = local_5a80;
      fStack_5a64 = local_5a80;
      fStack_5a5c = local_5a60;
      fStack_5a58 = local_5a60;
      fStack_5a54 = local_5a60;
      fStack_5a50 = local_5a60;
      fStack_5a4c = local_5a60;
      fStack_5a48 = local_5a60;
      fStack_5a44 = local_5a60;
      if ((!bVar63) || (bVar63 = 2 < uVar55, uVar55 = uVar55 + 1, bVar63)) break;
    }
    auVar79 = vandps_avx(auVar82,local_5d80);
    auVar82 = local_5d80 & auVar82;
    if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar82 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar82 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar82 >> 0x7f,0) == '\0') &&
          (auVar82 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar82 >> 0xbf,0) == '\0') &&
        (auVar82 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar82[0x1f])
    break;
  }
  auVar70._0_4_ = auVar118._0_4_ ^ auVar79._0_4_;
  auVar70._4_4_ = auVar118._4_4_ ^ auVar79._4_4_;
  auVar70._8_4_ = auVar118._8_4_ ^ auVar79._8_4_;
  auVar70._12_4_ = auVar118._12_4_ ^ auVar79._12_4_;
  auVar70._16_4_ = auVar118._16_4_ ^ auVar79._16_4_;
  auVar70._20_4_ = auVar118._20_4_ ^ auVar79._20_4_;
  auVar70._24_4_ = auVar118._24_4_ ^ auVar79._24_4_;
  auVar70._28_4_ = auVar118._28_4_ ^ auVar79._28_4_;
  unaff_R15 = local_5d00;
  local_5c60 = uVar35;
  uStack_5c58 = uVar36;
  uStack_5c50 = uVar37;
  local_5c40 = uVar32;
  uStack_5c38 = uVar33;
  uStack_5c30 = uVar34;
LAB_00691059:
  local_5ce0 = vorps_avx(local_5ce0,auVar70);
  auVar82 = auVar118._0_32_ & ~local_5ce0;
  if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar82 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar82 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar82 >> 0x7f,0) == '\0') &&
        (auVar82 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar82 >> 0xbf,0) == '\0') &&
      (auVar82 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar82[0x1f]) {
LAB_00691092:
    iVar52 = 3;
  }
  else {
    auVar75._8_4_ = 0xff800000;
    auVar75._0_8_ = 0xff800000ff800000;
    auVar75._12_4_ = 0xff800000;
    auVar75._16_4_ = 0xff800000;
    auVar75._20_4_ = 0xff800000;
    auVar75._24_4_ = 0xff800000;
    auVar75._28_4_ = 0xff800000;
    local_5840 = vblendvps_avx(local_5840,auVar75,local_5ce0);
    iVar52 = 0;
  }
LAB_00691095:
  if (iVar52 == 3) {
    auVar82 = vandps_avx(local_5b20,local_5ce0);
    auVar76._8_4_ = 0xff800000;
    auVar76._0_8_ = 0xff800000ff800000;
    auVar76._12_4_ = 0xff800000;
    auVar76._16_4_ = 0xff800000;
    auVar76._20_4_ = 0xff800000;
    auVar76._24_4_ = 0xff800000;
    auVar76._28_4_ = 0xff800000;
    auVar82 = vmaskmovps_avx(auVar82,auVar76);
    *(undefined1 (*) [32])local_5d00 = auVar82;
    return;
  }
  goto LAB_006907a8;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }